

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Rune * re2::Regexp::LeadingString(Regexp *re,int *nrune,ParseFlags *flags)

{
  uint8_t uVar1;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar2;
  
  do {
    uVar1 = re->op_;
    if (uVar1 != '\x05') {
      *flags = re->parse_flags_ & FoldCase;
      if (uVar1 == '\x04') {
        *nrune = (re->field_7).field_0.max_;
        return (Rune *)(re->field_7).field_1.name_;
      }
      if (uVar1 == '\x03') {
        *nrune = 1;
        return (Rune *)&re->field_7;
      }
LAB_001b1f26:
      *nrune = 0;
      return (Rune *)0x0;
    }
    if (re->nsub_ == 0) {
      *flags = re->parse_flags_ & FoldCase;
      goto LAB_001b1f26;
    }
    if (re->nsub_ == 1) {
      paVar2 = &re->field_5;
    }
    else {
      paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    re = paVar2->subone_;
  } while( true );
}

Assistant:

Rune* Regexp::LeadingString(Regexp* re, int *nrune,
                            Regexp::ParseFlags *flags) {
  while (re->op() == kRegexpConcat && re->nsub() > 0)
    re = re->sub()[0];

  *flags = static_cast<Regexp::ParseFlags>(re->parse_flags_ & Regexp::FoldCase);

  if (re->op() == kRegexpLiteral) {
    *nrune = 1;
    return &re->rune_;
  }

  if (re->op() == kRegexpLiteralString) {
    *nrune = re->nrunes_;
    return re->runes_;
  }

  *nrune = 0;
  return NULL;
}